

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

void __thiscall
libtorrent::session_handle::async_add_torrent(session_handle *this,add_torrent_params *params)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  add_torrent_params *this_01;
  torrent_info *__args;
  string_view f;
  add_torrent_params *p;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_handle_cpp:429:31)>
  guard;
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_handle_cpp:429:31)>
  local_48;
  undefined1 local_38 [32];
  
  bVar3 = digest32<160L>::is_all_zeros(&(params->info_hashes).v1);
  if (bVar3) {
    bVar3 = digest32<256L>::is_all_zeros(&(params->info_hashes).v2);
    if ((bVar3) &&
       ((params->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0)) {
      (params->info_hashes).v1.m_number._M_elems[4] = (params->info_hash).m_number._M_elems[4];
      uVar1 = *(undefined8 *)((params->info_hash).m_number._M_elems + 2);
      *(undefined8 *)(params->info_hashes).v1.m_number._M_elems =
           *(undefined8 *)(params->info_hash).m_number._M_elems;
      *(undefined8 *)((params->info_hashes).v1.m_number._M_elems + 2) = uVar1;
    }
  }
  __args = (params->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (__args != (torrent_info *)0x0) {
    local_38._0_8_ = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::torrent_info&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8),
               (torrent_info **)local_38,(allocator<libtorrent::torrent_info> *)&local_48,__args);
    uVar2 = local_38._8_8_;
    uVar1 = local_38._0_8_;
    local_38._0_8_ = (torrent_info *)0x0;
    local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (params->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (params->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar1;
    (params->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    }
  }
  this_01 = (add_torrent_params *)operator_new(0x350);
  add_torrent_params::add_torrent_params(this_01,params);
  local_48.m_armed = true;
  f._M_str = (char *)__args;
  f._M_len = (size_t)(this_01->save_path)._M_dataplus._M_p;
  local_48.m_fun.p = this_01;
  complete_abi_cxx11_((string *)local_38,(libtorrent *)(this_01->save_path)._M_string_length,f);
  ::std::__cxx11::string::operator=((string *)&this_01->save_path,(string *)local_38);
  if ((torrent_info *)local_38._0_8_ != (torrent_info *)(local_38 + 0x10)) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  async_call<void(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params*),libtorrent::add_torrent_params*&>
            (this,0x2d2964,(add_torrent_params **)0x0);
  local_48.m_armed = false;
  aux::
  scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_handle.cpp:429:31)>
  ::~scope_end_impl(&local_48);
  return;
}

Assistant:

void session_handle::async_add_torrent(add_torrent_params&& params)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

		// we cannot capture a unique_ptr into a lambda in c++11, so we use a raw
		// pointer for now. async_call uses a lambda expression to post the call
		// to the main thread
		// TODO: in C++14, use unique_ptr and move it into the lambda
		auto* p = new add_torrent_params(std::move(params));
		auto guard = aux::scope_end([p]{ delete p; });
		p->save_path = complete(p->save_path);

#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(*p);
#endif

		async_call(&session_impl::async_add_torrent, p);
		guard.disarm();
	}